

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vec.h
# Opt level: O0

double __thiscall
crnlib::vec<1U,_float>::normalize(vec<1U,_float> *this,vec<1U,_float> *pDefaultVec)

{
  double __x;
  double dVar1;
  uint i;
  double n;
  vec<1U,_float> *pDefaultVec_local;
  vec<1U,_float> *this_local;
  
  __x = (double)(this->m_s[0] * this->m_s[0]);
  if ((__x != 0.0) || (NAN(__x))) {
    dVar1 = sqrt(__x);
    operator*=(this,(float)(1.0 / dVar1));
  }
  else if (pDefaultVec != (vec<1U,_float> *)0x0) {
    operator=(this,pDefaultVec);
  }
  return __x;
}

Assistant:

inline double normalize(const vec* pDefaultVec = nullptr) {
            double n = m_s[0] * m_s[0];
            for (uint i = 1; i < N; i++)
            {
                n += m_s[i] * m_s[i];
            }

            if (n != 0)
            {
                *this *= static_cast<T>((1.0f / sqrt(n)));
            }
            else if (pDefaultVec)
            {
                *this = *pDefaultVec;
            }
            return n;
        }